

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfInputFile.cpp
# Opt level: O2

FrameBuffer * __thiscall Imf_2_5::InputFile::frameBuffer(InputFile *this)

{
  Data *pDVar1;
  FrameBuffer *pFVar2;
  Lock local_28;
  
  local_28._mutex = &this->_data->super_Mutex;
  if (((Data *)local_28._mutex)->compositor != (CompositeDeepScanLine *)0x0) {
    pFVar2 = CompositeDeepScanLine::frameBuffer(((Data *)local_28._mutex)->compositor);
    return pFVar2;
  }
  if (((Data *)local_28._mutex)->isTiled == true) {
    std::mutex::lock(local_28._mutex);
    local_28._locked = true;
    pDVar1 = this->_data;
    IlmThread_2_5::Lock::~Lock(&local_28);
    return &pDVar1->tFileBuffer;
  }
  pFVar2 = ScanLineInputFile::frameBuffer(((Data *)local_28._mutex)->sFile);
  return pFVar2;
}

Assistant:

const FrameBuffer &
InputFile::frameBuffer () const
{
    if(_data->compositor)
    {
        return _data->compositor->frameBuffer();
    }
    else if(_data->isTiled)
    {
	Lock lock (*_data);
	return _data->tFileBuffer;
    }
    else
    {
	return _data->sFile->frameBuffer();
    }
}